

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O3

string * __thiscall
cornelich::cycle_formatter_yyyymmddhh::date_from_cycle_impl_abi_cxx11_
          (string *__return_storage_ptr__,cycle_formatter_yyyymmddhh *this,int64_t cycle)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  vector_type attr;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sink;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that;
  void_ local_147;
  unused_type local_146;
  impl<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_mpl_::void__&,_boost::spirit::unused_type_&>
  local_145;
  uint local_144;
  uint local_140;
  int local_13c;
  int *local_138;
  uint *local_130;
  uint *local_128;
  long *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  string **local_108;
  long local_f8;
  string *local_f0;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  local_e8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  local_dc;
  undefined4 local_d0;
  undefined1 local_cc;
  undefined4 local_c4;
  undefined1 local_c0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_b8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_a8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_98;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_88;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_78;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_68;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_58;
  result_type local_44;
  
  lVar3 = (this->super_cycle_formatter).m_cycle_length * cycle;
  uVar5 = SUB168(SEXT816(lVar3) * SEXT816(0x20c49ba5e353f7cf),8);
  lVar8 = ((uVar5 >> 7) - ((long)uVar5 >> 0x3f)) * 1000000000;
  lVar3 = lVar3 / 86400000;
  iVar4 = (int)lVar3 - (uint)(lVar8 < lVar3 * 86400000000000);
  uVar1 = (iVar4 + 0xafa6cU) / 0x23ab1;
  uVar6 = uVar1 * -0x23ab1 + iVar4 + 0xafa6c;
  uVar2 = ((uVar6 >> 2) / 0x23ab + uVar6) - (uVar6 / 0x23ab0 + (uVar6 >> 2) / 0x16d);
  iVar7 = (uVar6 - uVar2 / 0x5b4) + uVar2 / 0x8e94 + (uVar2 / 0x16d) * -0x16d;
  uVar6 = iVar7 * 5 + 2;
  local_140 = uVar6 / 0x99 + 3;
  if (0x5f9 < uVar6) {
    local_140 = uVar6 / 0x99 - 9;
  }
  local_f8 = ((long)iVar4 * -86400000000000 + lVar8) / 3600000000000;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_108 = &local_f0;
  local_88.child0 = (proto_child0)&local_c4;
  local_c4 = 4;
  local_c0 = 0x30;
  local_78.child0 = &local_88;
  local_88.child1 = (proto_child1)&boost::spirit::int_;
  local_98.child0 = (proto_child0)&local_d0;
  local_d0 = 2;
  local_cc = 0x30;
  local_78.child1 = &local_98;
  local_98.child1 = (proto_child1)&boost::spirit::uint_;
  local_68.child0 = &local_78;
  local_a8.child0 = &local_dc;
  local_dc.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>
  .super_store<0UL,_int>.elem = 2;
  local_dc.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>
  .super_store<1UL,_char>.elem = '0';
  local_68.child1 = &local_a8;
  local_a8.child1 = (proto_child1)&boost::spirit::uint_;
  local_58.child0 = &local_68;
  local_b8.child0 = &local_e8;
  local_e8.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>
  .super_store<0UL,_int>.elem = 2;
  local_e8.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>
  .super_store<1UL,_char>.elem = '0';
  local_58.child1 = &local_b8;
  local_b8.child1 = (proto_child1)&boost::spirit::uint_;
  local_13c = (int)(short)((short)uVar1 * 400 +
                           (short)((uint)((ulong)uVar2 * 0x16719f361 >> 0x21) >> 8) +
                          (ushort)(local_140 < 3));
  local_138 = &local_13c;
  local_140 = local_140 & 0xff;
  local_130 = &local_140;
  local_144 = (iVar7 - ((uVar6 / 0x99) * 0x99 + 2) / 5) + 1 & 0xff;
  local_128 = &local_144;
  local_120 = &local_f8;
  local_118 = 0;
  uStack_110 = 0;
  local_f0 = __return_storage_ptr__;
  boost::spirit::detail::
  make_binary<boost::spirit::karma::domain,_boost::proto::tagns_::tag::shift_left,_boost::spirit::meta_compiler<boost::spirit::karma::domain>::meta_grammar,_true>
  ::
  impl<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_mpl_::void__&,_boost::spirit::unused_type_&>
  ::operator()(&local_44,&local_145,&local_58,&local_147,&local_146);
  boost::spirit::karma::
  base_sequence<boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_int_generator<int,boost::spirit::unused_type,boost::spirit::unused_type,10u,false>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_i...ost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::nil_>>>>>>
  ::
  generate_impl<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::__cxx11::string>,mpl_::int_<3>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::fusion::vector<int_const&,unsigned_int_const&,unsigned_int_const&,long_const&>const,mpl_::bool_<false>,mpl_::bool_<false>>
            ((base_sequence<boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_int_generator<int,boost::spirit::unused_type,boost::spirit::unused_type,10u,false>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_i___ost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::nil_>>>>>>
              *)&local_44,&local_118,&boost::spirit::unused,&boost::spirit::unused,&local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string cycle_formatter_yyyymmddhh::date_from_cycle_impl(std::int64_t cycle) const
{
    const auto s = static_cast<std::time_t>(cycle * m_cycle_length / 1000);
    auto ts = system_clock::time_point(seconds(s));
    auto daypoint = floor<days>(ts);
    auto ymd = year_month_day(daypoint);
    auto tod = make_time(ts - daypoint);

    using namespace boost::spirit;

    std::string result;
    std::back_insert_iterator<std::string> sink(result);
    karma::generate(sink,
                    karma::right_align(4, '0')[karma::int_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_],
            int(ymd.year()), unsigned(ymd.month()), unsigned(ymd.day()), tod.hours().count());
    return result;
}